

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_26::BinaryReader::ReadRefType(BinaryReader *this,Type *out_value,char *desc)

{
  Result RVar1;
  uint uVar2;
  
  RVar1 = ReadType(this,out_value,desc);
  if (RVar1.enum_ != Error) {
    uVar2 = out_value->enum_ + 0x17;
    if ((uVar2 < 8) && ((0xc5U >> (uVar2 & 0x1f) & 1) != 0)) {
      return (Result)Ok;
    }
    PrintError(this,"%s must be a reference type",desc);
  }
  return (Result)Error;
}

Assistant:

Result BinaryReader::ReadRefType(Type* out_value, const char* desc) {
  CHECK_RESULT(ReadType(out_value, desc));
  ERROR_UNLESS(out_value->IsRef(), "%s must be a reference type", desc);
  return Result::Ok;
}